

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util_lite.cc
# Opt level: O1

void google::protobuf::TestUtilLite::ExpectPackedExtensionsModified
               (TestPackedExtensionsLite *message)

{
  internal iVar1;
  bool bVar2;
  anon_union_32_1_493b367e_for_TestPackedExtensionsLite_3 *this;
  char *pcVar3;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  AssertHelper local_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_50._M_head_impl._0_4_ = 2;
  this = &message->field_0;
  local_48.data_._0_4_ =
       (float)internal::ExtensionSet::ExtensionSize
                        (&(this->_impl_)._extensions_,proto2_unittest::packed_int32_extension_lite);
  testing::internal::CmpHelperEQ<int,int>
            (local_40,"2","message.ExtensionSize(unittest::packed_int32_extension_lite)",
             (int *)&local_50,(int *)&local_48);
  iVar1 = local_40[0];
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0x763,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  if (iVar1 != (internal)0x0) {
    local_50._M_head_impl._0_4_ = 2;
    local_48.data_._0_4_ =
         (float)internal::ExtensionSet::ExtensionSize
                          (&(this->_impl_)._extensions_,proto2_unittest::packed_int64_extension_lite
                          );
    testing::internal::CmpHelperEQ<int,int>
              (local_40,"2","message.ExtensionSize(unittest::packed_int64_extension_lite)",
               (int *)&local_50,(int *)&local_48);
    iVar1 = local_40[0];
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_38->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                 ,0x764,pcVar3);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_50._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_50._M_head_impl + 8))();
      }
    }
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
    if (iVar1 != (internal)0x0) {
      local_50._M_head_impl._0_4_ = 2;
      local_48.data_._0_4_ =
           (float)internal::ExtensionSet::ExtensionSize
                            (&(this->_impl_)._extensions_,
                             proto2_unittest::packed_uint32_extension_lite);
      testing::internal::CmpHelperEQ<int,int>
                (local_40,"2","message.ExtensionSize(unittest::packed_uint32_extension_lite)",
                 (int *)&local_50,(int *)&local_48);
      iVar1 = local_40[0];
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_50);
        if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (local_38->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                   ,0x765,pcVar3);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (local_50._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_50._M_head_impl + 8))();
        }
      }
      if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_38,local_38);
      }
      if (iVar1 != (internal)0x0) {
        local_50._M_head_impl._0_4_ = 2;
        local_48.data_._0_4_ =
             (float)internal::ExtensionSet::ExtensionSize
                              (&(this->_impl_)._extensions_,
                               proto2_unittest::packed_uint64_extension_lite);
        testing::internal::CmpHelperEQ<int,int>
                  (local_40,"2","message.ExtensionSize(unittest::packed_uint64_extension_lite)",
                   (int *)&local_50,(int *)&local_48);
        iVar1 = local_40[0];
        if (local_40[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_50);
          if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = "";
          }
          else {
            pcVar3 = (local_38->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                     ,0x766,pcVar3);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (local_50._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_50._M_head_impl + 8))();
          }
        }
        if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_38,local_38);
        }
        if (iVar1 != (internal)0x0) {
          local_50._M_head_impl._0_4_ = 2;
          local_48.data_._0_4_ =
               (float)internal::ExtensionSet::ExtensionSize
                                (&(this->_impl_)._extensions_,
                                 proto2_unittest::packed_sint32_extension_lite);
          testing::internal::CmpHelperEQ<int,int>
                    (local_40,"2","message.ExtensionSize(unittest::packed_sint32_extension_lite)",
                     (int *)&local_50,(int *)&local_48);
          iVar1 = local_40[0];
          if (local_40[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_50);
            if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar3 = "";
            }
            else {
              pcVar3 = (local_38->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                       ,0x767,pcVar3);
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
            testing::internal::AssertHelper::~AssertHelper(&local_48);
            if (local_50._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_50._M_head_impl + 8))();
            }
          }
          if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_38,local_38);
          }
          if (iVar1 != (internal)0x0) {
            local_50._M_head_impl._0_4_ = 2;
            local_48.data_._0_4_ =
                 (float)internal::ExtensionSet::ExtensionSize
                                  (&(this->_impl_)._extensions_,
                                   proto2_unittest::packed_sint64_extension_lite);
            testing::internal::CmpHelperEQ<int,int>
                      (local_40,"2","message.ExtensionSize(unittest::packed_sint64_extension_lite)",
                       (int *)&local_50,(int *)&local_48);
            iVar1 = local_40[0];
            if (local_40[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_50);
              if (local_38 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar3 = "";
              }
              else {
                pcVar3 = (local_38->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_48,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                         ,0x768,pcVar3);
              testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
              testing::internal::AssertHelper::~AssertHelper(&local_48);
              if (local_50._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_50._M_head_impl + 8))();
              }
            }
            if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_38,local_38);
            }
            if (iVar1 != (internal)0x0) {
              local_50._M_head_impl._0_4_ = 2;
              local_48.data_._0_4_ =
                   (float)internal::ExtensionSet::ExtensionSize
                                    (&(this->_impl_)._extensions_,
                                     proto2_unittest::packed_fixed32_extension_lite);
              testing::internal::CmpHelperEQ<int,int>
                        (local_40,"2",
                         "message.ExtensionSize(unittest::packed_fixed32_extension_lite)",
                         (int *)&local_50,(int *)&local_48);
              iVar1 = local_40[0];
              if (local_40[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_50);
                if (local_38 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = (local_38->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_48,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                           ,0x769,pcVar3);
                testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
                testing::internal::AssertHelper::~AssertHelper(&local_48);
                if (local_50._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                }
              }
              if (local_38 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_38,local_38);
              }
              if (iVar1 != (internal)0x0) {
                local_50._M_head_impl._0_4_ = 2;
                local_48.data_._0_4_ =
                     (float)internal::ExtensionSet::ExtensionSize
                                      (&(this->_impl_)._extensions_,
                                       proto2_unittest::packed_fixed64_extension_lite);
                testing::internal::CmpHelperEQ<int,int>
                          (local_40,"2",
                           "message.ExtensionSize(unittest::packed_fixed64_extension_lite)",
                           (int *)&local_50,(int *)&local_48);
                iVar1 = local_40[0];
                if (local_40[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_50);
                  if (local_38 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar3 = "";
                  }
                  else {
                    pcVar3 = (local_38->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_48,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                             ,0x76a,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
                  testing::internal::AssertHelper::~AssertHelper(&local_48);
                  if (local_50._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_50._M_head_impl + 8))();
                  }
                }
                if (local_38 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_38,local_38);
                }
                if (iVar1 != (internal)0x0) {
                  local_50._M_head_impl._0_4_ = 2;
                  local_48.data_._0_4_ =
                       (float)internal::ExtensionSet::ExtensionSize
                                        (&(this->_impl_)._extensions_,
                                         proto2_unittest::packed_sfixed32_extension_lite);
                  testing::internal::CmpHelperEQ<int,int>
                            (local_40,"2",
                             "message.ExtensionSize(unittest::packed_sfixed32_extension_lite)",
                             (int *)&local_50,(int *)&local_48);
                  iVar1 = local_40[0];
                  if (local_40[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_50);
                    if (local_38 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = (local_38->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_48,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                               ,0x76b,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
                    testing::internal::AssertHelper::~AssertHelper(&local_48);
                    if (local_50._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_50._M_head_impl + 8))();
                    }
                  }
                  if (local_38 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_38,local_38);
                  }
                  if (iVar1 != (internal)0x0) {
                    local_50._M_head_impl._0_4_ = 2;
                    local_48.data_._0_4_ =
                         (float)internal::ExtensionSet::ExtensionSize
                                          (&(this->_impl_)._extensions_,
                                           proto2_unittest::packed_sfixed64_extension_lite);
                    testing::internal::CmpHelperEQ<int,int>
                              (local_40,"2",
                               "message.ExtensionSize(unittest::packed_sfixed64_extension_lite)",
                               (int *)&local_50,(int *)&local_48);
                    iVar1 = local_40[0];
                    if (local_40[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&local_50);
                      if (local_38 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar3 = "";
                      }
                      else {
                        pcVar3 = (local_38->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_48,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                 ,0x76c,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
                      testing::internal::AssertHelper::~AssertHelper(&local_48);
                      if (local_50._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)local_50._M_head_impl + 8))();
                      }
                    }
                    if (local_38 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_38,local_38);
                    }
                    if (iVar1 != (internal)0x0) {
                      local_50._M_head_impl._0_4_ = 2;
                      local_48.data_._0_4_ =
                           (float)internal::ExtensionSet::ExtensionSize
                                            (&(this->_impl_)._extensions_,
                                             proto2_unittest::packed_float_extension_lite);
                      testing::internal::CmpHelperEQ<int,int>
                                (local_40,"2",
                                 "message.ExtensionSize(unittest::packed_float_extension_lite)",
                                 (int *)&local_50,(int *)&local_48);
                      iVar1 = local_40[0];
                      if (local_40[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&local_50);
                        if (local_38 ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar3 = "";
                        }
                        else {
                          pcVar3 = (local_38->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_48,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                   ,0x76d,pcVar3);
                        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
                        testing::internal::AssertHelper::~AssertHelper(&local_48);
                        if (local_50._M_head_impl !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)local_50._M_head_impl + 8))();
                        }
                      }
                      if (local_38 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_38,local_38);
                      }
                      if (iVar1 != (internal)0x0) {
                        local_50._M_head_impl._0_4_ = 2;
                        local_48.data_._0_4_ =
                             (float)internal::ExtensionSet::ExtensionSize
                                              (&(this->_impl_)._extensions_,
                                               proto2_unittest::packed_double_extension_lite);
                        testing::internal::CmpHelperEQ<int,int>
                                  (local_40,"2",
                                   "message.ExtensionSize(unittest::packed_double_extension_lite)",
                                   (int *)&local_50,(int *)&local_48);
                        iVar1 = local_40[0];
                        if (local_40[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&local_50);
                          if (local_38 ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar3 = "";
                          }
                          else {
                            pcVar3 = (local_38->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_48,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                     ,0x76e,pcVar3);
                          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50)
                          ;
                          testing::internal::AssertHelper::~AssertHelper(&local_48);
                          if (local_50._M_head_impl !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                            (**(code **)(*(long *)local_50._M_head_impl + 8))();
                          }
                        }
                        if (local_38 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_38,local_38);
                        }
                        if (iVar1 != (internal)0x0) {
                          local_50._M_head_impl._0_4_ = 2;
                          local_48.data_._0_4_ =
                               (float)internal::ExtensionSet::ExtensionSize
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_bool_extension_lite);
                          testing::internal::CmpHelperEQ<int,int>
                                    (local_40,"2",
                                     "message.ExtensionSize(unittest::packed_bool_extension_lite)",
                                     (int *)&local_50,(int *)&local_48);
                          iVar1 = local_40[0];
                          if (local_40[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_50);
                            if (local_38 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar3 = "";
                            }
                            else {
                              pcVar3 = (local_38->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_48,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                       ,0x76f,pcVar3);
                            testing::internal::AssertHelper::operator=
                                      (&local_48,(Message *)&local_50);
                            testing::internal::AssertHelper::~AssertHelper(&local_48);
                            if (local_50._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_50._M_head_impl + 8))();
                            }
                          }
                          if (local_38 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_38,local_38);
                          }
                          if (iVar1 != (internal)0x0) {
                            local_50._M_head_impl._0_4_ = 2;
                            local_48.data_._0_4_ =
                                 (float)internal::ExtensionSet::ExtensionSize
                                                  (&(this->_impl_)._extensions_,
                                                   proto2_unittest::packed_enum_extension_lite);
                            testing::internal::CmpHelperEQ<int,int>
                                      (local_40,"2",
                                       "message.ExtensionSize(unittest::packed_enum_extension_lite)"
                                       ,(int *)&local_50,(int *)&local_48);
                            iVar1 = local_40[0];
                            if (local_40[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&local_50);
                              if (local_38 ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar3 = "";
                              }
                              else {
                                pcVar3 = (local_38->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_48,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                         ,0x770,pcVar3);
                              testing::internal::AssertHelper::operator=
                                        (&local_48,(Message *)&local_50);
                              testing::internal::AssertHelper::~AssertHelper(&local_48);
                              if (local_50._M_head_impl !=
                                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                (**(code **)(*(long *)local_50._M_head_impl + 8))();
                              }
                            }
                            if (local_38 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_38,local_38);
                            }
                            if (iVar1 != (internal)0x0) {
                              local_50._M_head_impl._0_4_ = 0x259;
                              local_48.data_._0_4_ =
                                   (float)internal::ExtensionSet::GetRepeatedInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_int32_extension_lite,0)
                              ;
                              testing::internal::CmpHelperEQ<int,int>
                                        (local_40,"601",
                                         "message.GetExtension(unittest::packed_int32_extension_lite, 0)"
                                         ,(int *)&local_50,(int *)&local_48);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x772,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_48.data_._0_4_ = 8.43582e-43;
                              local_50._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)internal::ExtensionSet::GetRepeatedInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_int64_extension_lite,0);
                              testing::internal::CmpHelperEQ<int,long>
                                        (local_40,"602",
                                         "message.GetExtension(unittest::packed_int64_extension_lite, 0)"
                                         ,(int *)&local_48,(long *)&local_50);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x774,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_50._M_head_impl._0_4_ = 0x25b;
                              local_48.data_._0_4_ =
                                   (float)internal::ExtensionSet::GetRepeatedUInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_uint32_extension_lite,0
                                                    );
                              testing::internal::CmpHelperEQ<int,unsigned_int>
                                        (local_40,"603",
                                         "message.GetExtension(unittest::packed_uint32_extension_lite, 0)"
                                         ,(int *)&local_50,(uint *)&local_48);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x776,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_48.data_._0_4_ = 8.46384e-43;
                              local_50._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)internal::ExtensionSet::GetRepeatedUInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_uint64_extension_lite,0);
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        (local_40,"604",
                                         "message.GetExtension(unittest::packed_uint64_extension_lite, 0)"
                                         ,(int *)&local_48,(unsigned_long *)&local_50);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x778,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_50._M_head_impl._0_4_ = 0x25d;
                              local_48.data_._0_4_ =
                                   (float)internal::ExtensionSet::GetRepeatedInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_sint32_extension_lite,0
                                                    );
                              testing::internal::CmpHelperEQ<int,int>
                                        (local_40,"605",
                                         "message.GetExtension(unittest::packed_sint32_extension_lite, 0)"
                                         ,(int *)&local_50,(int *)&local_48);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x77a,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_48.data_._0_4_ = 8.49187e-43;
                              local_50._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)internal::ExtensionSet::GetRepeatedInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_sint64_extension_lite,0);
                              testing::internal::CmpHelperEQ<int,long>
                                        (local_40,"606",
                                         "message.GetExtension(unittest::packed_sint64_extension_lite, 0)"
                                         ,(int *)&local_48,(long *)&local_50);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x77c,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_50._M_head_impl._0_4_ = 0x25f;
                              local_48.data_._0_4_ =
                                   (float)internal::ExtensionSet::GetRepeatedUInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_fixed32_extension_lite,
                                                     0);
                              testing::internal::CmpHelperEQ<int,unsigned_int>
                                        (local_40,"607",
                                         "message.GetExtension(unittest::packed_fixed32_extension_lite, 0)"
                                         ,(int *)&local_50,(uint *)&local_48);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x77e,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_48.data_._0_4_ = 8.51989e-43;
                              local_50._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)internal::ExtensionSet::GetRepeatedUInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_fixed64_extension_lite,0);
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        (local_40,"608",
                                         "message.GetExtension(unittest::packed_fixed64_extension_lite, 0)"
                                         ,(int *)&local_48,(unsigned_long *)&local_50);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x780,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_50._M_head_impl._0_4_ = 0x261;
                              local_48.data_._0_4_ =
                                   (float)internal::ExtensionSet::GetRepeatedInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_sfixed32_extension_lite
                                                     ,0);
                              testing::internal::CmpHelperEQ<int,int>
                                        (local_40,"609",
                                         "message.GetExtension(unittest::packed_sfixed32_extension_lite, 0)"
                                         ,(int *)&local_50,(int *)&local_48);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x782,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_48.data_._0_4_ = 8.54792e-43;
                              local_50._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)internal::ExtensionSet::GetRepeatedInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_sfixed64_extension_lite,0);
                              testing::internal::CmpHelperEQ<int,long>
                                        (local_40,"610",
                                         "message.GetExtension(unittest::packed_sfixed64_extension_lite, 0)"
                                         ,(int *)&local_48,(long *)&local_50);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x784,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_50._M_head_impl._0_4_ = 0x263;
                              local_48.data_._0_4_ =
                                   internal::ExtensionSet::GetRepeatedFloat
                                             (&(this->_impl_)._extensions_,
                                              proto2_unittest::packed_float_extension_lite,0);
                              testing::internal::CmpHelperEQ<int,float>
                                        (local_40,"611",
                                         "message.GetExtension(unittest::packed_float_extension_lite, 0)"
                                         ,(int *)&local_50,(float *)&local_48);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x786,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_48.data_._0_4_ = 8.57595e-43;
                              local_50._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)internal::ExtensionSet::GetRepeatedDouble
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_double_extension_lite,0);
                              testing::internal::CmpHelperEQ<int,double>
                                        (local_40,"612",
                                         "message.GetExtension(unittest::packed_double_extension_lite, 0)"
                                         ,(int *)&local_48,(double *)&local_50);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x788,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_50._M_head_impl._0_1_ = 1;
                              bVar2 = internal::ExtensionSet::GetRepeatedBool
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_bool_extension_lite,0);
                              local_48.data_._0_4_ = (float)CONCAT31(local_48.data_._1_3_,bVar2);
                              testing::internal::CmpHelperEQ<bool,bool>
                                        (local_40,"true",
                                         "message.GetExtension(unittest::packed_bool_extension_lite, 0)"
                                         ,(bool *)&local_50,(bool *)&local_48);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x78a,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_50._M_head_impl._0_4_ = 5;
                              local_48.data_._0_4_ =
                                   (float)internal::ExtensionSet::GetRepeatedEnum
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_enum_extension_lite,0);
                              testing::internal::
                              CmpHelperEQ<proto2_unittest::ForeignEnumLite,proto2_unittest::ForeignEnumLite>
                                        (local_40,"unittest::FOREIGN_LITE_BAR",
                                         "message.GetExtension(unittest::packed_enum_extension_lite, 0)"
                                         ,(ForeignEnumLite *)&local_50,(ForeignEnumLite *)&local_48)
                              ;
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x78c,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_50._M_head_impl._0_4_ = 0x321;
                              local_48.data_._0_4_ =
                                   (float)internal::ExtensionSet::GetRepeatedInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_int32_extension_lite,1)
                              ;
                              testing::internal::CmpHelperEQ<int,int>
                                        (local_40,"801",
                                         "message.GetExtension(unittest::packed_int32_extension_lite, 1)"
                                         ,(int *)&local_50,(int *)&local_48);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x790,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_48.data_._0_4_ = 1.12384e-42;
                              local_50._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)internal::ExtensionSet::GetRepeatedInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_int64_extension_lite,1);
                              testing::internal::CmpHelperEQ<int,long>
                                        (local_40,"802",
                                         "message.GetExtension(unittest::packed_int64_extension_lite, 1)"
                                         ,(int *)&local_48,(long *)&local_50);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x792,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_50._M_head_impl._0_4_ = 0x323;
                              local_48.data_._0_4_ =
                                   (float)internal::ExtensionSet::GetRepeatedUInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_uint32_extension_lite,1
                                                    );
                              testing::internal::CmpHelperEQ<int,unsigned_int>
                                        (local_40,"803",
                                         "message.GetExtension(unittest::packed_uint32_extension_lite, 1)"
                                         ,(int *)&local_50,(uint *)&local_48);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x794,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_48.data_._0_4_ = 1.12664e-42;
                              local_50._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)internal::ExtensionSet::GetRepeatedUInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_uint64_extension_lite,1);
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        (local_40,"804",
                                         "message.GetExtension(unittest::packed_uint64_extension_lite, 1)"
                                         ,(int *)&local_48,(unsigned_long *)&local_50);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x796,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_50._M_head_impl._0_4_ = 0x325;
                              local_48.data_._0_4_ =
                                   (float)internal::ExtensionSet::GetRepeatedInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_sint32_extension_lite,1
                                                    );
                              testing::internal::CmpHelperEQ<int,int>
                                        (local_40,"805",
                                         "message.GetExtension(unittest::packed_sint32_extension_lite, 1)"
                                         ,(int *)&local_50,(int *)&local_48);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x798,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_48.data_._0_4_ = 1.12945e-42;
                              local_50._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)internal::ExtensionSet::GetRepeatedInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_sint64_extension_lite,1);
                              testing::internal::CmpHelperEQ<int,long>
                                        (local_40,"806",
                                         "message.GetExtension(unittest::packed_sint64_extension_lite, 1)"
                                         ,(int *)&local_48,(long *)&local_50);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x79a,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_50._M_head_impl._0_4_ = 0x327;
                              local_48.data_._0_4_ =
                                   (float)internal::ExtensionSet::GetRepeatedUInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_fixed32_extension_lite,
                                                     1);
                              testing::internal::CmpHelperEQ<int,unsigned_int>
                                        (local_40,"807",
                                         "message.GetExtension(unittest::packed_fixed32_extension_lite, 1)"
                                         ,(int *)&local_50,(uint *)&local_48);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x79c,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_48.data_._0_4_ = 1.13225e-42;
                              local_50._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)internal::ExtensionSet::GetRepeatedUInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_fixed64_extension_lite,1);
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        (local_40,"808",
                                         "message.GetExtension(unittest::packed_fixed64_extension_lite, 1)"
                                         ,(int *)&local_48,(unsigned_long *)&local_50);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x79e,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_50._M_head_impl._0_4_ = 0x329;
                              local_48.data_._0_4_ =
                                   (float)internal::ExtensionSet::GetRepeatedInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_sfixed32_extension_lite
                                                     ,1);
                              testing::internal::CmpHelperEQ<int,int>
                                        (local_40,"809",
                                         "message.GetExtension(unittest::packed_sfixed32_extension_lite, 1)"
                                         ,(int *)&local_50,(int *)&local_48);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x7a0,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_48.data_._0_4_ = 1.13505e-42;
                              local_50._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)internal::ExtensionSet::GetRepeatedInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_sfixed64_extension_lite,1);
                              testing::internal::CmpHelperEQ<int,long>
                                        (local_40,"810",
                                         "message.GetExtension(unittest::packed_sfixed64_extension_lite, 1)"
                                         ,(int *)&local_48,(long *)&local_50);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x7a2,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_50._M_head_impl._0_4_ = 0x32b;
                              local_48.data_._0_4_ =
                                   internal::ExtensionSet::GetRepeatedFloat
                                             (&(this->_impl_)._extensions_,
                                              proto2_unittest::packed_float_extension_lite,1);
                              testing::internal::CmpHelperEQ<int,float>
                                        (local_40,"811",
                                         "message.GetExtension(unittest::packed_float_extension_lite, 1)"
                                         ,(int *)&local_50,(float *)&local_48);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x7a4,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_48.data_._0_4_ = 1.13785e-42;
                              local_50._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)internal::ExtensionSet::GetRepeatedDouble
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_double_extension_lite,1);
                              testing::internal::CmpHelperEQ<int,double>
                                        (local_40,"812",
                                         "message.GetExtension(unittest::packed_double_extension_lite, 1)"
                                         ,(int *)&local_48,(double *)&local_50);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x7a6,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_50._M_head_impl._0_1_ = 1;
                              bVar2 = internal::ExtensionSet::GetRepeatedBool
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_bool_extension_lite,1);
                              local_48.data_._0_4_ = (float)CONCAT31(local_48.data_._1_3_,bVar2);
                              testing::internal::CmpHelperEQ<bool,bool>
                                        (local_40,"true",
                                         "message.GetExtension(unittest::packed_bool_extension_lite, 1)"
                                         ,(bool *)&local_50,(bool *)&local_48);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x7a8,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                              local_50._M_head_impl._0_4_ = 4;
                              local_48.data_._0_4_ =
                                   (float)internal::ExtensionSet::GetRepeatedEnum
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_enum_extension_lite,1);
                              testing::internal::
                              CmpHelperEQ<proto2_unittest::ForeignEnumLite,proto2_unittest::ForeignEnumLite>
                                        (local_40,"unittest::FOREIGN_LITE_FOO",
                                         "message.GetExtension(unittest::packed_enum_extension_lite, 1)"
                                         ,(ForeignEnumLite *)&local_50,(ForeignEnumLite *)&local_48)
                              ;
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_50);
                                if (local_38 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_38->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x7aa,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                                testing::internal::AssertHelper::~AssertHelper(&local_48);
                                if (local_50._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                                }
                              }
                              if (local_38 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_38,local_38);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TestUtilLite::ExpectPackedExtensionsModified(
    const unittest::TestPackedExtensionsLite& message) {
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_int32_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_int64_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_uint32_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_uint64_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_sint32_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_sint64_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_fixed32_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_fixed64_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_sfixed32_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_sfixed64_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_float_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_double_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_bool_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_enum_extension_lite));
  EXPECT_EQ(601,
            message.GetExtension(unittest::packed_int32_extension_lite, 0));
  EXPECT_EQ(602,
            message.GetExtension(unittest::packed_int64_extension_lite, 0));
  EXPECT_EQ(603,
            message.GetExtension(unittest::packed_uint32_extension_lite, 0));
  EXPECT_EQ(604,
            message.GetExtension(unittest::packed_uint64_extension_lite, 0));
  EXPECT_EQ(605,
            message.GetExtension(unittest::packed_sint32_extension_lite, 0));
  EXPECT_EQ(606,
            message.GetExtension(unittest::packed_sint64_extension_lite, 0));
  EXPECT_EQ(607,
            message.GetExtension(unittest::packed_fixed32_extension_lite, 0));
  EXPECT_EQ(608,
            message.GetExtension(unittest::packed_fixed64_extension_lite, 0));
  EXPECT_EQ(609,
            message.GetExtension(unittest::packed_sfixed32_extension_lite, 0));
  EXPECT_EQ(610,
            message.GetExtension(unittest::packed_sfixed64_extension_lite, 0));
  EXPECT_EQ(611,
            message.GetExtension(unittest::packed_float_extension_lite, 0));
  EXPECT_EQ(612,
            message.GetExtension(unittest::packed_double_extension_lite, 0));
  EXPECT_EQ(true,
            message.GetExtension(unittest::packed_bool_extension_lite, 0));
  EXPECT_EQ(unittest::FOREIGN_LITE_BAR,
            message.GetExtension(unittest::packed_enum_extension_lite, 0));

  // Actually verify the second (modified) elements now.
  EXPECT_EQ(801,
            message.GetExtension(unittest::packed_int32_extension_lite, 1));
  EXPECT_EQ(802,
            message.GetExtension(unittest::packed_int64_extension_lite, 1));
  EXPECT_EQ(803,
            message.GetExtension(unittest::packed_uint32_extension_lite, 1));
  EXPECT_EQ(804,
            message.GetExtension(unittest::packed_uint64_extension_lite, 1));
  EXPECT_EQ(805,
            message.GetExtension(unittest::packed_sint32_extension_lite, 1));
  EXPECT_EQ(806,
            message.GetExtension(unittest::packed_sint64_extension_lite, 1));
  EXPECT_EQ(807,
            message.GetExtension(unittest::packed_fixed32_extension_lite, 1));
  EXPECT_EQ(808,
            message.GetExtension(unittest::packed_fixed64_extension_lite, 1));
  EXPECT_EQ(809,
            message.GetExtension(unittest::packed_sfixed32_extension_lite, 1));
  EXPECT_EQ(810,
            message.GetExtension(unittest::packed_sfixed64_extension_lite, 1));
  EXPECT_EQ(811,
            message.GetExtension(unittest::packed_float_extension_lite, 1));
  EXPECT_EQ(812,
            message.GetExtension(unittest::packed_double_extension_lite, 1));
  EXPECT_EQ(true,
            message.GetExtension(unittest::packed_bool_extension_lite, 1));
  EXPECT_EQ(unittest::FOREIGN_LITE_FOO,
            message.GetExtension(unittest::packed_enum_extension_lite, 1));
}